

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O3

parser_error parse_constants_dun_gen(parser *p)

{
  wchar_t wVar1;
  int iVar2;
  parser_error pVar3;
  void *pvVar4;
  char *__s1;
  undefined2 uVar5;
  
  pvVar4 = parser_priv(p);
  __s1 = parser_getsym(p,"label");
  wVar1 = parser_getint(p,"value");
  if (wVar1 < L'\0') {
    pVar3 = PARSE_ERROR_INVALID_VALUE;
  }
  else {
    iVar2 = strcmp(__s1,"cent-max");
    uVar5 = (undefined2)wVar1;
    if (iVar2 == 0) {
      *(undefined2 *)((long)pvVar4 + 0x4c) = uVar5;
    }
    else {
      iVar2 = strcmp(__s1,"door-max");
      if (iVar2 == 0) {
        *(undefined2 *)((long)pvVar4 + 0x4e) = uVar5;
      }
      else {
        iVar2 = strcmp(__s1,"wall-max");
        if (iVar2 == 0) {
          *(undefined2 *)((long)pvVar4 + 0x50) = uVar5;
        }
        else {
          iVar2 = strcmp(__s1,"tunn-max");
          if (iVar2 == 0) {
            *(undefined2 *)((long)pvVar4 + 0x52) = uVar5;
          }
          else {
            iVar2 = strcmp(__s1,"amt-room");
            if (iVar2 == 0) {
              *(undefined2 *)((long)pvVar4 + 0x54) = uVar5;
            }
            else {
              iVar2 = strcmp(__s1,"amt-item");
              if (iVar2 == 0) {
                *(undefined2 *)((long)pvVar4 + 0x56) = uVar5;
              }
              else {
                iVar2 = strcmp(__s1,"amt-gold");
                if (iVar2 == 0) {
                  *(undefined2 *)((long)pvVar4 + 0x58) = uVar5;
                }
                else {
                  iVar2 = strcmp(__s1,"pit-max");
                  if (iVar2 != 0) {
                    return PARSE_ERROR_UNDEFINED_DIRECTIVE;
                  }
                  *(undefined2 *)((long)pvVar4 + 0x5a) = uVar5;
                }
              }
            }
          }
        }
      }
    }
    pVar3 = PARSE_ERROR_NONE;
  }
  return pVar3;
}

Assistant:

static enum parser_error parse_constants_dun_gen(struct parser *p) {
	struct angband_constants *z;
	const char *label;
	int value;

	z = parser_priv(p);
	label = parser_getsym(p, "label");
	value = parser_getint(p, "value");

	if (value < 0)
		return PARSE_ERROR_INVALID_VALUE;

	if (streq(label, "cent-max"))
		z->level_room_max = value;
	else if (streq(label, "door-max"))
		z->level_door_max = value;
	else if (streq(label, "wall-max"))
		z->wall_pierce_max = value;
	else if (streq(label, "tunn-max"))
		z->tunn_grid_max = value;
	else if (streq(label, "amt-room"))
		z->room_item_av = value;
	else if (streq(label, "amt-item"))
		z->both_item_av = value;
	else if (streq(label, "amt-gold"))
		z->both_gold_av = value;
	else if (streq(label, "pit-max"))
		z->level_pit_max = value;
	else
		return PARSE_ERROR_UNDEFINED_DIRECTIVE;

	return PARSE_ERROR_NONE;
}